

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotated_binary_text_gen.cpp
# Opt level: O2

string * flatbuffers::anon_unknown_7::ToValueString<unsigned_long>
                   (string *__return_storage_ptr__,BinaryRegion *region,uint8_t *binary)

{
  unsigned_long __val;
  ulong uVar1;
  uint8_t extraout_DL;
  uint8_t i;
  uint8_t extraout_DL_00;
  ulong uVar2;
  byte *pbVar3;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  uVar1 = region->length;
  __val = *(unsigned_long *)(binary + region->offset);
  pbVar3 = binary + region->offset + uVar1;
  i = extraout_DL;
  for (uVar2 = 0; pbVar3 = pbVar3 + -1, uVar2 < uVar1; uVar2 = uVar2 + 1) {
    ToHex_abi_cxx11_(&local_50,(flatbuffers *)(ulong)*pbVar3,i);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    uVar1 = region->length;
    i = extraout_DL_00;
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::to_string(&local_50,__val);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string ToValueString(const BinaryRegion &region, const uint8_t *binary) {
  std::string s;
  s += "0x";
  const T val = ReadScalar<T>(binary + region.offset);
  const uint64_t start_index = region.offset + region.length - 1;
  for (uint64_t i = 0; i < region.length; ++i) {
    s += ToHex(binary[start_index - i]);
  }
  s += " (";
  s += ToString(val);
  s += ")";
  return s;
}